

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall cmFindBaseDebugState::~cmFindBaseDebugState(cmFindBaseDebugState *this)

{
  cmFindBase *pcVar1;
  pointer pDVar2;
  string_view sep;
  DebugLibState *state;
  pointer args;
  string_view prefix;
  string_view suffix;
  string path;
  bool local_8c;
  bool local_8b;
  bool local_8a;
  bool local_89;
  string buffer;
  string local_50;
  
  if ((this->FindCommand->super_cmFindCommon).DebugMode == true) {
    cmStrCat<std::__cxx11::string&,char_const(&)[38]>
              (&buffer,&this->CommandName,(char (*) [38])" called with the following settings:\n");
    cmStrCat<char_const(&)[8],std::__cxx11::string_const&,char_const(&)[2]>
              (&path,(char (*) [8])"  VAR: ",&this->FindCommand->VariableName,(char (*) [2])0x7d0796
              );
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    sep._M_str = "\n         ";
    sep._M_len = 10;
    prefix._M_str = "\"";
    prefix._M_len = 1;
    suffix._M_str = "\"";
    suffix._M_len = 1;
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_50,prefix,&this->FindCommand->Names,suffix,sep);
    cmStrCat<char_const(&)[10],std::__cxx11::string,char_const(&)[2]>
              (&path,(char (*) [10])"  NAMES: ",&local_50,(char (*) [2])0x7d0796);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::~string((string *)&local_50);
    cmStrCat<char_const(&)[18],std::__cxx11::string_const&,char_const(&)[2]>
              (&path,(char (*) [18])"  Documentation: ",&this->FindCommand->VariableDocumentation,
               (char (*) [2])0x7d0796);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::append((char *)&buffer);
    cmStrCat<char_const(&)[29],bool_const&,char_const(&)[2]>
              (&path,(char (*) [29])"    Only Search Frameworks: ",
               &(this->FindCommand->super_cmFindCommon).SearchFrameworkOnly,(char (*) [2])0x7d0796);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    cmStrCat<char_const(&)[29],bool_const&,char_const(&)[2]>
              (&path,(char (*) [29])"    Search Frameworks Last: ",
               &(this->FindCommand->super_cmFindCommon).SearchFrameworkLast,(char (*) [2])0x7d0796);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    cmStrCat<char_const(&)[30],bool_const&,char_const(&)[2]>
              (&path,(char (*) [30])"    Search Frameworks First: ",
               &(this->FindCommand->super_cmFindCommon).SearchFrameworkFirst,(char (*) [2])0x7d0796)
    ;
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    std::__cxx11::string::append((char *)&buffer);
    cmStrCat<char_const(&)[28],bool_const&,char_const(&)[2]>
              (&path,(char (*) [28])"    Only Search AppBundle: ",
               &(this->FindCommand->super_cmFindCommon).SearchAppBundleOnly,(char (*) [2])0x7d0796);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    cmStrCat<char_const(&)[28],bool_const&,char_const(&)[2]>
              (&path,(char (*) [28])"    Search AppBundle Last: ",
               &(this->FindCommand->super_cmFindCommon).SearchAppBundleLast,(char (*) [2])0x7d0796);
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    cmStrCat<char_const(&)[29],bool_const&,char_const(&)[2]>
              (&path,(char (*) [29])"    Search AppBundle First: ",
               &(this->FindCommand->super_cmFindCommon).SearchAppBundleFirst,(char (*) [2])0x7d0796)
    ;
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    pcVar1 = this->FindCommand;
    if ((pcVar1->super_cmFindCommon).NoDefaultPath == true) {
      std::__cxx11::string::append((char *)&buffer);
    }
    else {
      local_50._M_dataplus._M_p._0_1_ = (pcVar1->super_cmFindCommon).NoCMakePath ^ 1;
      local_89 = (bool)((pcVar1->super_cmFindCommon).NoCMakeEnvironmentPath ^ 1);
      local_8a = (bool)((pcVar1->super_cmFindCommon).NoSystemEnvironmentPath ^ 1);
      local_8b = (bool)((pcVar1->super_cmFindCommon).NoCMakeSystemPath ^ 1);
      local_8c = (bool)((pcVar1->super_cmFindCommon).NoCMakeInstallPath ^ 1);
      cmStrCat<char_const(&)[30],bool,char_const(&)[2],char_const(&)[42],bool,char_const(&)[2],char_const(&)[43],bool,char_const(&)[2],char_const(&)[37],bool,char_const(&)[2],char_const(&)[34],bool,char_const(&)[2]>
                (&path,(char (*) [30])"  CMAKE_FIND_USE_CMAKE_PATH: ",(bool *)&local_50,
                 (char (*) [2])0x7d0796,(char (*) [42])"  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",
                 &local_89,(char (*) [2])0x7d0796,
                 (char (*) [43])"  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",&local_8a,
                 (char (*) [2])0x7d0796,(char (*) [37])"  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",
                 &local_8b,(char (*) [2])0x7d0796,(char (*) [34])"  CMAKE_FIND_USE_INSTALL_PREFIX: "
                 ,&local_8c,(char (*) [2])0x7d0796);
      std::__cxx11::string::append((string *)&buffer);
      std::__cxx11::string::~string((string *)&path);
    }
    cmStrCat<std::__cxx11::string&,char_const(&)[38]>
              (&path,&this->CommandName,(char (*) [38])" considered the following locations:\n");
    std::__cxx11::string::append((string *)&buffer);
    std::__cxx11::string::~string((string *)&path);
    pDVar2 = (this->FailedSearchLocations).
             super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (args = (this->FailedSearchLocations).
                super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
                ._M_impl.super__Vector_impl_data._M_start; args != pDVar2; args = args + 1) {
      cmStrCat<char_const(&)[3],std::__cxx11::string_const&>
                (&path,(char (*) [3])0x7840d1,&args->path);
      if ((args->regexName)._M_string_length != 0) {
        cmStrCat<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&>
                  (&local_50,&path,(char (*) [2])0x8477b1,&args->regexName);
        std::__cxx11::string::operator=((string *)&path,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      cmStrCat<std::__cxx11::string&,char_const(&)[2]>(&local_50,&path,(char (*) [2])0x7d0796);
      std::__cxx11::string::append((string *)&buffer);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&path);
    }
    if ((this->FoundSearchLocation).path._M_string_length == 0) {
      std::__cxx11::string::append((char *)&buffer);
    }
    else {
      cmStrCat<char_const(&)[25],std::__cxx11::string&,char_const(&)[2]>
                (&path,(char (*) [25])"The item was found at\n  ",&(this->FoundSearchLocation).path,
                 (char (*) [2])0x7d0796);
      std::__cxx11::string::append((string *)&buffer);
      std::__cxx11::string::~string((string *)&path);
    }
    cmFindCommon::DebugMessage(&this->FindCommand->super_cmFindCommon,&buffer);
    std::__cxx11::string::~string((string *)&buffer);
  }
  DebugLibState::~DebugLibState(&this->FoundSearchLocation);
  std::
  vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ::~vector(&this->FailedSearchLocations);
  std::__cxx11::string::~string((string *)&this->CommandName);
  return;
}

Assistant:

cmFindBaseDebugState::~cmFindBaseDebugState()
{
  if (this->FindCommand->DebugMode) {
    std::string buffer =
      cmStrCat(this->CommandName, " called with the following settings:\n");
    buffer += cmStrCat("  VAR: ", this->FindCommand->VariableName, "\n");
    buffer += cmStrCat(
      "  NAMES: ", cmWrap("\"", this->FindCommand->Names, "\"", "\n         "),
      "\n");
    buffer += cmStrCat(
      "  Documentation: ", this->FindCommand->VariableDocumentation, "\n");
    buffer += "  Framework\n";
    buffer += cmStrCat("    Only Search Frameworks: ",
                       this->FindCommand->SearchFrameworkOnly, "\n");

    buffer += cmStrCat("    Search Frameworks Last: ",
                       this->FindCommand->SearchFrameworkLast, "\n");
    buffer += cmStrCat("    Search Frameworks First: ",
                       this->FindCommand->SearchFrameworkFirst, "\n");
    buffer += "  AppBundle\n";
    buffer += cmStrCat("    Only Search AppBundle: ",
                       this->FindCommand->SearchAppBundleOnly, "\n");
    buffer += cmStrCat("    Search AppBundle Last: ",
                       this->FindCommand->SearchAppBundleLast, "\n");
    buffer += cmStrCat("    Search AppBundle First: ",
                       this->FindCommand->SearchAppBundleFirst, "\n");

    if (this->FindCommand->NoDefaultPath) {
      buffer += "  NO_DEFAULT_PATH Enabled\n";
    } else {
      buffer += cmStrCat(
        "  CMAKE_FIND_USE_CMAKE_PATH: ", !this->FindCommand->NoCMakePath, "\n",
        "  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoCMakeEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoSystemEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",
        !this->FindCommand->NoCMakeSystemPath, "\n",
        "  CMAKE_FIND_USE_INSTALL_PREFIX: ",
        !this->FindCommand->NoCMakeInstallPath, "\n");
    }

    buffer +=
      cmStrCat(this->CommandName, " considered the following locations:\n");
    for (auto const& state : this->FailedSearchLocations) {
      std::string path = cmStrCat("  ", state.path);
      if (!state.regexName.empty()) {
        path = cmStrCat(path, "/", state.regexName);
      }
      buffer += cmStrCat(path, "\n");
    }

    if (!this->FoundSearchLocation.path.empty()) {
      buffer += cmStrCat("The item was found at\n  ",
                         this->FoundSearchLocation.path, "\n");
    } else {
      buffer += "The item was not found.\n";
    }

    this->FindCommand->DebugMessage(buffer);
  }
}